

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_cse_conv(jit_State *J)

{
  ushort uVar1;
  uint uVar2;
  TRef TVar3;
  IRIns *pIVar4;
  jit_State *in_RDI;
  IRIns *ir;
  IRRef ref;
  uint8_t guard;
  IRRef op2;
  IRRef op1;
  uint local_20;
  
  if ((in_RDI->flags & 0x20000) != 0) {
    uVar2 = (uint)(in_RDI->fold).ins.field_0.op1;
    uVar1 = in_RDI->chain[0x59];
    while (local_20 = (uint)uVar1, uVar2 < local_20) {
      pIVar4 = (in_RDI->cur).ir + local_20;
      if ((((pIVar4->field_0).op1 == uVar2) &&
          (((pIVar4->field_0).op2 & 0xfff) == ((in_RDI->fold).ins.field_0.op2 & 0xfff))) &&
         (((in_RDI->fold).ins.field_1.t.irt & 0x80) <= ((pIVar4->field_1).t.irt & 0x80))) {
        return local_20;
      }
      uVar1 = (pIVar4->field_0).prev;
    }
  }
  TVar3 = lj_ir_emit(in_RDI);
  return TVar3;
}

Assistant:

LJFOLD(CONV any any)
LJFOLDF(cse_conv)
{
  if (LJ_LIKELY(J->flags & JIT_F_OPT_CSE)) {
    IRRef op1 = fins->op1, op2 = (fins->op2 & IRCONV_MODEMASK);
    uint8_t guard = irt_isguard(fins->t);
    IRRef ref = J->chain[IR_CONV];
    while (ref > op1) {
      IRIns *ir = IR(ref);
      /* Commoning with stronger checks is ok. */
      if (ir->op1 == op1 && (ir->op2 & IRCONV_MODEMASK) == op2 &&
	  irt_isguard(ir->t) >= guard)
	return ref;
      ref = ir->prev;
    }
  }
  return EMITFOLD;  /* No fallthrough to regular CSE. */
}